

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_move16_32(void)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  uint value;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  
  uVar3 = m68ki_read_imm_16();
  uVar5 = (ulong)(m68ki_cpu.ir & 7);
  uVar4 = (ulong)(uVar3 >> 10 & 0x1c);
  uVar3 = *(uint *)((long)m68ki_cpu.dar + uVar4 + 0x20);
  uVar6 = m68ki_cpu.s_flag | 1;
  value = m68ki_read_32_fc(m68ki_cpu.dar[uVar5 + 8],m68ki_cpu.s_flag | m68ki_address_space);
  m68ki_write_32_fc(uVar3,uVar6,value);
  iVar2 = *(int *)((long)m68ki_cpu.dar + uVar4 + 0x20);
  uVar6 = m68ki_cpu.s_flag | 1;
  uVar3 = m68ki_read_32_fc(m68ki_cpu.dar[uVar5 + 8] + 4,m68ki_cpu.s_flag | m68ki_address_space);
  m68ki_write_32_fc(iVar2 + 4,uVar6,uVar3);
  iVar2 = *(int *)((long)m68ki_cpu.dar + uVar4 + 0x20);
  uVar6 = m68ki_cpu.s_flag | 1;
  uVar3 = m68ki_read_32_fc(m68ki_cpu.dar[uVar5 + 8] + 8,m68ki_cpu.s_flag | m68ki_address_space);
  m68ki_write_32_fc(iVar2 + 8,uVar6,uVar3);
  iVar2 = *(int *)((long)m68ki_cpu.dar + uVar4 + 0x20);
  uVar6 = m68ki_cpu.s_flag | 1;
  uVar3 = m68ki_read_32_fc(m68ki_cpu.dar[uVar5 + 8] + 0xc,m68ki_cpu.s_flag | m68ki_address_space);
  m68ki_write_32_fc(iVar2 + 0xc,uVar6,uVar3);
  m68ki_cpu.dar[uVar5 + 8] = m68ki_cpu.dar[uVar5 + 8] + 0x10;
  piVar1 = (int *)((long)m68ki_cpu.dar + uVar4 + 0x20);
  *piVar1 = *piVar1 + 0x10;
  return;
}

Assistant:

static void m68k_op_move16_32(void)
{
	uint16 w2 = OPER_I_16();
	int ax = REG_IR & 7;
	int ay = (w2 >> 12) & 7;

	m68ki_write_32(REG_A[ay],    m68ki_read_32(REG_A[ax]));
	m68ki_write_32(REG_A[ay]+4,  m68ki_read_32(REG_A[ax]+4));
	m68ki_write_32(REG_A[ay]+8,  m68ki_read_32(REG_A[ax]+8));
	m68ki_write_32(REG_A[ay]+12, m68ki_read_32(REG_A[ax]+12));

	REG_A[ax] += 16;
	REG_A[ay] += 16;
}